

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TgNextPermutation(Abc_TgMan_t *pMan)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  TiedGroup *pTVar5;
  char *pDirs;
  char *pVars;
  TiedGroup *pGrp;
  int nGvars;
  int j;
  int i;
  Abc_TgMan_t *pMan_local;
  
  nGvars = 0;
  do {
    if (pMan->nGroups <= nGvars) {
      return 0;
    }
    pTVar5 = pMan->pGroup + nGvars;
    iVar3 = (int)pTVar5->nGVars;
    if (iVar3 != 1) {
      cVar1 = pTVar5->iStart;
      cVar2 = pTVar5->iStart;
      iVar4 = Abc_NextPermSwapC(pMan->pPerm + (int)cVar1,pMan->pPermDir + (int)cVar2,iVar3);
      if (-1 < iVar4) {
        Abc_TgSwapAdjacentSymGroups(pMan,iVar4 + pTVar5->iStart);
        return 1;
      }
      Abc_TgSwapAdjacentSymGroups(pMan,(int)pTVar5->iStart);
      iVar3 = Abc_TgIsInitPerm(pMan->pPerm + (int)cVar1,pMan->pPermDir + (int)cVar2,iVar3);
      if (iVar3 == 0) {
        __assert_fail("Abc_TgIsInitPerm(pVars, pDirs, nGvars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                      ,0x8b8,"int Abc_TgNextPermutation(Abc_TgMan_t *)");
      }
    }
    nGvars = nGvars + 1;
  } while( true );
}

Assistant:

static int Abc_TgNextPermutation(Abc_TgMan_t * pMan)
{
    int i, j, nGvars;
    TiedGroup * pGrp;
    char * pVars;
    signed char * pDirs;
    for (i = 0; i < pMan->nGroups; i++)
    {
        pGrp = pMan->pGroup + i;
        nGvars = pGrp->nGVars;
        if (nGvars == 1) continue;
        pVars = pMan->pPerm + pGrp->iStart;
        pDirs = pMan->pPermDir + pGrp->iStart;
        j = Abc_NextPermSwapC(pVars, pDirs, nGvars);
        if (j >= 0)
        {
            Abc_TgSwapAdjacentSymGroups(pMan, j + pGrp->iStart);
            return 1;
        }
        Abc_TgSwapAdjacentSymGroups(pMan, pGrp->iStart);
        assert(Abc_TgIsInitPerm(pVars, pDirs, nGvars));
    }
    return 0;
}